

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsMessageCopy(HelicsMessage source_message,HelicsMessage dest_message,HelicsError *err)

{
  Message *pMVar1;
  Message *pMVar2;
  
  pMVar1 = getMessageObj(source_message,err);
  if (pMVar1 != (Message *)0x0) {
    pMVar2 = getMessageObj(dest_message,err);
    if (pMVar2 != (Message *)0x0) {
      helics::SmallBuffer::operator=(&pMVar2->data,&pMVar1->data);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pMVar2->dest,&pMVar1->dest);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pMVar2->original_source,&pMVar1->original_source);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pMVar2->source,&pMVar1->source);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pMVar2->original_dest,&pMVar1->original_dest);
      (pMVar2->time).internalTimeCode = (pMVar1->time).internalTimeCode;
      pMVar2->messageID = pMVar1->messageID;
      pMVar2->flags = pMVar1->flags;
    }
  }
  return;
}

Assistant:

void helicsMessageCopy(HelicsMessage source_message, HelicsMessage dest_message, HelicsError* err)
{
    auto* mess_src = getMessageObj(source_message, err);
    if (mess_src == nullptr) {
        return;
    }
    auto* mess_dest = getMessageObj(dest_message, err);
    if (mess_dest == nullptr) {
        return;
    }
    mess_dest->data = mess_src->data;
    mess_dest->dest = mess_src->dest;
    mess_dest->original_source = mess_src->original_source;
    mess_dest->source = mess_src->source;
    mess_dest->original_dest = mess_src->original_dest;
    mess_dest->time = mess_src->time;
    mess_dest->messageID = mess_src->messageID;
    mess_dest->flags = mess_src->flags;
}